

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void unpack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
                size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
                size_t *p_index)

{
  pointer ppVar1;
  double *pdVar2;
  size_t sVar3;
  pointer ppVar4;
  particle *ppVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  particle *ppVar19;
  particle *ppVar20;
  int ii;
  int iVar21;
  plist *a;
  
  a = (plist *)((long)k * 0x10 +
               *(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)i * 8) + (long)j * 8
                        ));
  spatial_region::erase
            ((spatial_region *)
             psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a);
  for (iVar21 = 0; sVar3 = *pn_index,
      iVar21 < (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[sVar3]; iVar21 = iVar21 + 1) {
    ppVar19 = spatial_region::new_particle
                        ((spatial_region *)
                         psr._M_t.
                         super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                         .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl);
    sVar3 = *p_index;
    *p_index = sVar3 + 1;
    ppVar4 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ppVar1 = ppVar4 + sVar3;
    dVar6 = ppVar1->y;
    dVar7 = ppVar1->z;
    dVar8 = ppVar1->ux;
    dVar9 = ppVar1->uy;
    dVar10 = ppVar1->uz;
    dVar11 = ppVar1->g;
    dVar12 = ppVar1->q;
    pdVar2 = &ppVar4[sVar3].uz;
    dVar13 = *pdVar2;
    dVar14 = pdVar2[1];
    dVar15 = pdVar2[2];
    dVar16 = pdVar2[3];
    dVar17 = pdVar2[4];
    uVar18 = pdVar2[5];
    ppVar5 = (particle *)pdVar2[6];
    ppVar20 = (particle *)pdVar2[7];
    ppVar19->x = ppVar1->x;
    ppVar19->y = dVar6;
    ppVar19->z = dVar7;
    ppVar19->ux = dVar8;
    ppVar19->uy = dVar9;
    ppVar19->uz = dVar10;
    ppVar19->g = dVar11;
    ppVar19->q = dVar12;
    ppVar19->uz = dVar13;
    ppVar19->g = dVar14;
    ppVar19->q = dVar15;
    ppVar19->cmr = dVar16;
    ppVar19->chi = dVar17;
    *(undefined8 *)&ppVar19->trn = uVar18;
    ppVar19->next = ppVar5;
    ppVar19->previous = ppVar20;
    ppVar19->previous = a->start;
    a->start = ppVar19;
  }
  a->head = (particle *)0x0;
  ppVar5 = a->start;
  ppVar20 = (particle *)0x0;
  while (ppVar19 = ppVar5, ppVar19 != (particle *)0x0) {
    ppVar19->next = ppVar20;
    a->head = ppVar19;
    ppVar5 = ppVar19->previous;
    a->start = ppVar5;
    ppVar20 = ppVar19;
  }
  a->start = ppVar20;
  *pn_index = sVar3 + 1;
  return;
}

Assistant:

void unpack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    plist & pl = psr->cp[i][j][k].pl;
    psr->erase(pl);

    for (int ii=0; ii<particle_numbers[pn_index]; ii++) {
        particle * tmp = psr->new_particle();
        *tmp = particles[p_index++];
        tmp->previous = pl.start;
        pl.start = tmp;
    }
    pl.head = 0;
    while (pl.start != 0) {
        pl.start->next = pl.head;
        pl.head = pl.start;
        pl.start = pl.start->previous;
    }
    pl.start = pl.head;

    pn_index++;
}